

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormatLite::Int32Size(RepeatedField<int> *value)

{
  int n;
  int *data;
  size_t sVar1;
  
  if ((undefined1  [16])((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    data = &(value->soo_rep_).field_0.long_rep.size;
  }
  else {
    data = (int *)LongSooRep::elements((LongSooRep *)value);
  }
  n = SooRep::size(&value->soo_rep_,
                   (undefined1  [16])
                   ((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                   (undefined1  [16])0x0);
  sVar1 = VarintSize<false,true,int>(data,n);
  return sVar1;
}

Assistant:

size_t WireFormatLite::Int32Size(const RepeatedField<int32_t>& value) {
  return VarintSize<false, true>(value.data(), value.size());
}